

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::compiler::Version::ByteSizeLong(Version *this)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  string *value;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  Version *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = Version::unknown_fields(this);
    sStack_38 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf) != 0) {
    bVar1 = has_suffix(this);
    if (bVar1) {
      value = suffix_abi_cxx11_(this);
      sVar4 = internal::WireFormatLite::StringSize(value);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_major(this);
    if (bVar1) {
      iVar2 = major(this);
      sVar4 = internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_minor(this);
    if (bVar1) {
      iVar2 = minor(this);
      sVar4 = internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_patch(this);
    if (bVar1) {
      iVar2 = patch(this);
      sVar4 = internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
  }
  iVar3 = internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t Version::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.Version)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 15u) {
    // optional string suffix = 4;
    if (has_suffix()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->suffix());
    }

    // optional int32 major = 1;
    if (has_major()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->major());
    }

    // optional int32 minor = 2;
    if (has_minor()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->minor());
    }

    // optional int32 patch = 3;
    if (has_patch()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->patch());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}